

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSEncodeVector copy_vector_to_FFSBuffer(FFSBuffer buf,FFSEncodeVector vec)

{
  void *in_RSI;
  FFSBuffer in_RDI;
  size_t remainder;
  size_t i;
  ssize_t vec_offset;
  long local_20;
  ulong local_18;
  
  local_18 = (long)in_RSI - (long)in_RDI->tmp_buffer;
  if ((in_RSI < in_RDI->tmp_buffer) ||
     ((void *)((long)in_RDI->tmp_buffer + in_RDI->tmp_buffer_size) <= in_RSI)) {
    for (local_20 = 0; *(long *)((long)in_RSI + local_20 * 0x10) != 0; local_20 = local_20 + 1) {
    }
    local_18 = add_to_tmp_buffer(in_RDI,(size_t)in_RSI);
    if ((local_18 & 0xf) != 0) {
      local_18 = (0x10 - (local_18 & 0xf)) + local_18;
    }
    memcpy((void *)((long)in_RDI->tmp_buffer + local_18),in_RSI,(local_20 + 1) * 0x10);
  }
  return (FFSEncodeVector)((long)in_RDI->tmp_buffer + local_18);
}

Assistant:

extern FFSEncodeVector
copy_vector_to_FFSBuffer(FFSBuffer buf, FFSEncodeVector vec)
{
    ssize_t vec_offset = (char *) vec - (char *)buf->tmp_buffer;

    if (((char*)vec < (char*)buf->tmp_buffer)
        || ((char*)vec >= (char*)buf->tmp_buffer + buf->tmp_buffer_size)) {
        size_t i, remainder;
        for (i = 0; vec[i].iov_base; ++i);
        vec_offset = add_to_tmp_buffer(buf, (i + 2) * sizeof(*vec));
	remainder = vec_offset % sizeof(*vec);
	if (remainder != 0) {
	    vec_offset += sizeof(*vec) - remainder;
	}
        memcpy((char *) buf->tmp_buffer + vec_offset, vec, (i + 1) * sizeof(*vec));
    }

    return (FFSEncodeVector) ((char *) buf->tmp_buffer + vec_offset);
}